

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt_GetFontOffsetForIndex_internal(uchar *font_collection,int index)

{
  int iVar1;
  stbtt_uint32 sVar2;
  stbtt_int32 sVar3;
  int in_ESI;
  stbtt_uint8 *in_RDI;
  stbtt_int32 n;
  stbtt_uint32 local_4;
  
  iVar1 = stbtt__isfont(in_RDI);
  if (iVar1 == 0) {
    if ((((*in_RDI == 't') && (in_RDI[1] == 't')) && (in_RDI[2] == 'c')) &&
       ((in_RDI[3] == 'f' &&
        ((sVar2 = ttULONG(in_RDI + 4), sVar2 == 0x10000 ||
         (sVar2 = ttULONG(in_RDI + 4), sVar2 == 0x20000)))))) {
      sVar3 = ttLONG(in_RDI + 8);
      if (in_ESI < sVar3) {
        local_4 = ttULONG(in_RDI + (long)(in_ESI << 2) + 0xc);
      }
      else {
        local_4 = 0xffffffff;
      }
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    local_4 = 0xffffffff;
    if (in_ESI == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int stbtt_GetFontOffsetForIndex_internal(unsigned char *font_collection, int index)
{
/*  if it's just a font, there's only one valid index */
if (stbtt__isfont(font_collection))
return index == 0 ? 0 : -1;

/*  check if it's a TTC */
if (stbtt_tag(font_collection, "ttcf")) {
/*  version 1? */
if (ttULONG(font_collection+4) == 0x00010000 || ttULONG(font_collection+4) == 0x00020000) {
stbtt_int32 n = ttLONG(font_collection+8);
if (index >= n)
return -1;
return ttULONG(font_collection+12+index*4);
}
}
return -1;
}